

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XprHelper.h
# Opt level: O2

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,-1,1,false>const,-1,1,false>const>>,3,0>
       ::
       run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,_1,1,false>const,_1,1,false>const>>
                 (redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false>_>_>
                  *eval,scalar_sum_op<double,_double> *func,
                 CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false>_>
                 *xpr)

{
  long lVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  Index index;
  long lVar7;
  long lVar8;
  long lVar9;
  Scalar SVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  lVar1 = (xpr->m_xpr).
          super_BlockImpl<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false,_true>
          .
          super_MapBase<Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false>,_0>
          .m_rows.m_value;
  lVar7 = 4;
  pdVar2 = (eval->
           super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false>_>_>
           ).
           super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false>_>,_Eigen::internal::IndexBased,_double>
           .m_d.argImpl.
           super_evaluator<Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false>_>
           .
           super_block_evaluator<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false,_true>
           .
           super_mapbase_evaluator<Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>,__1,_1,_false>,_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
           .m_data;
  if (lVar1 + 1U < 3) {
    SVar10 = *pdVar2 * *pdVar2;
    for (lVar7 = 1; lVar7 < lVar1; lVar7 = lVar7 + 1) {
      SVar10 = SVar10 + pdVar2[lVar7] * pdVar2[lVar7];
    }
  }
  else {
    lVar8 = (lVar1 / 2) * 2;
    dVar13 = *pdVar2 * *pdVar2;
    dVar14 = pdVar2[1] * pdVar2[1];
    if (3 < lVar1) {
      lVar9 = (lVar1 / 4) * 4;
      dVar11 = pdVar2[2] * pdVar2[2];
      dVar12 = pdVar2[3] * pdVar2[3];
      for (; lVar7 < lVar9; lVar7 = lVar7 + 4) {
        dVar3 = pdVar2[lVar7];
        dVar4 = (pdVar2 + lVar7)[1];
        dVar5 = pdVar2[lVar7 + 2];
        dVar6 = (pdVar2 + lVar7 + 2)[1];
        dVar13 = dVar13 + dVar3 * dVar3;
        dVar14 = dVar14 + dVar4 * dVar4;
        dVar11 = dVar11 + dVar5 * dVar5;
        dVar12 = dVar12 + dVar6 * dVar6;
      }
      dVar13 = dVar13 + dVar11;
      dVar14 = dVar14 + dVar12;
      if (lVar9 < lVar8) {
        dVar11 = pdVar2[(lVar1 / 4) * 4];
        dVar12 = (pdVar2 + (lVar1 / 4) * 4)[1];
        dVar13 = dVar13 + dVar11 * dVar11;
        dVar14 = dVar14 + dVar12 * dVar12;
      }
    }
    SVar10 = dVar14 + dVar13;
    for (; lVar8 < lVar1; lVar8 = lVar8 + 1) {
      SVar10 = SVar10 + pdVar2[lVar8] * pdVar2[lVar8];
    }
  }
  return SVar10;
}

Assistant:

explicit variable_if_dynamic(T value = 0) EIGEN_NO_THROW : m_value(value) {}